

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_immediate_read_error_for_get_payload(void)

{
  cio_error cVar1;
  char data [5];
  undefined4 local_50;
  undefined1 local_4c;
  ws_frame local_48;
  undefined4 local_28;
  undefined8 local_24;
  undefined8 uStack_1c;
  undefined4 local_14;
  undefined2 local_10;
  
  local_48.data = &local_50;
  local_4c = 0x61;
  local_50 = 0x61616161;
  local_48.frame_type = CIO_WEBSOCKET_TEXT_FRAME;
  local_48.direction = FROM_CLIENT;
  local_48.data_length = 5;
  local_48.last_frame = true;
  local_48.rsv = false;
  local_28 = 8;
  local_24 = 0;
  uStack_1c = 0;
  local_14 = 0;
  local_10 = 1;
  serialize_frames(&local_48,2);
  cio_buffered_stream_read_at_most_fake.custom_fake = bs_read_at_most_immediate_error;
  cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x467,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x469,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
             "websocket parameter of read_handler not correct",0x46a,UNITY_DISPLAY_STYLE_HEX64);
  if (read_handler_fake.arg1_val != (void *)0x0) {
    UnityFail("context parameter of read_handler not correct",0x46b);
  }
  UnityAssertEqualNumber
            (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not correct",0x46c,
             UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg4_val == (uint8_t *)0x0) {
    UnityAssertEqualNumber
              (0,read_handler_fake.arg5_val,"length parameter of read_handler not correct",0x46e,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was not called",0x470,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
               "ws parameter in error callback not correct",0x471,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (-0x62,(long)on_error_fake.arg1_val,"error callback called with wrong status code",
               0x472,UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("data parameter of read_handler not correct",0x46d);
}

Assistant:

static void test_immediate_read_error_for_get_payload(void)
{
	unsigned int frame_type = CIO_WEBSOCKET_TEXT_FRAME;
	char data[5];
	memset(data, 'a', sizeof(data));
	struct ws_frame frames[] = {
	    {.frame_type = frame_type, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	cio_buffered_stream_read_at_most_fake.custom_fake = bs_read_at_most_immediate_error;

	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg4_val, "data parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(0, read_handler_fake.arg5_val, "length parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "ws parameter in error callback not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_ADDRESS_IN_USE, on_error_fake.arg1_val, "error callback called with wrong status code");
}